

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeezenet.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  int i;
  int iVar4;
  ulong uVar5;
  long lVar6;
  vector<float,_std::allocator<float>_> cls_scores;
  Extractor ex;
  Net squeezenet;
  Mat local_118;
  float mean_vals [3];
  Mat in;
  Mat m;
  int local_70;
  int local_6c;
  uchar *local_68;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    std::__cxx11::string::string((string *)&squeezenet,pcVar1,(allocator *)&in);
    cv::imread((string *)&m,(int)&squeezenet);
    std::__cxx11::string::~string((string *)&squeezenet);
    cVar2 = cv::Mat::empty();
    if (cVar2 == '\0') {
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&squeezenet);
      squeezenet.opt.use_vulkan_compute = true;
      ncnn::Net::load_param(&squeezenet,"squeezenet_v1.1.param");
      ncnn::Net::load_model(&squeezenet,"squeezenet_v1.1.bin");
      ncnn::Mat::from_pixels_resize(&in,local_68,2,local_6c,local_70,0xe3,0xe3,(Allocator *)0x0);
      mean_vals[0] = 104.0;
      mean_vals[1] = 117.0;
      mean_vals[2] = 123.0;
      ncnn::Mat::substract_mean_normalize(&in,mean_vals,(float *)0x0);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",&in);
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = 0;
      local_118._20_8_ = 0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      ncnn::Extractor::extract(&ex,"prob",&local_118,0);
      std::vector<float,_std::allocator<float>_>::resize(&cls_scores,(long)local_118.w);
      uVar3 = 0;
      uVar5 = (ulong)(uint)local_118.w;
      if (local_118.w < 1) {
        uVar5 = uVar3;
      }
      for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar3] = *(float *)((long)local_118.data + uVar3 * 4);
      }
      ncnn::Mat::~Mat(&local_118);
      ncnn::Extractor::~Extractor(&ex);
      ncnn::Mat::~Mat(&in);
      ncnn::Net::~Net(&squeezenet);
      squeezenet.opt.blob_allocator = (Allocator *)0x0;
      squeezenet._vptr_Net = (_func_int **)0x0;
      squeezenet.opt.lightmode = false;
      squeezenet.opt._1_3_ = 0;
      squeezenet.opt.num_threads = 0;
      uVar5 = (ulong)((long)cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      iVar4 = (int)uVar5;
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::resize
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 &squeezenet,(long)iVar4);
      uVar3 = 0;
      uVar5 = uVar5 & 0xffffffff;
      if (iVar4 < 1) {
        uVar5 = uVar3;
      }
      for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        *(float *)(squeezenet._vptr_Net + uVar3) =
             cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[uVar3];
        *(int *)((long)squeezenet._vptr_Net + uVar3 * 8 + 4) = (int)uVar3;
      }
      std::
      __partial_sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<float,int>>>>
                (squeezenet._vptr_Net,squeezenet._vptr_Net + 3,squeezenet.opt._0_8_);
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        fprintf(_stderr,"%d = %f\n",SUB84((double)*(float *)(squeezenet._vptr_Net + lVar6),0),
                (ulong)*(uint *)((long)squeezenet._vptr_Net + lVar6 * 8 + 4));
      }
      std::_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::
      ~_Vector_base((_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                    &squeezenet);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&cls_scores.super__Vector_base<float,_std::allocator<float>_>);
      iVar4 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar1);
      iVar4 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<float> cls_scores;
    detect_squeezenet(m, cls_scores);

    print_topk(cls_scores, 3);

    return 0;
}